

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

int cargo_set_option_descriptionv(cargo_t ctx,char *optname,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  void **pp;
  char **strp;
  size_t opt_i;
  size_t name_i;
  size_t local_28 [2];
  
  local_28[0] = 0;
  local_28[1] = 0;
  if (ctx != (cargo_t)0x0) {
    iVar1 = _cargo_find_option_name(ctx,optname,local_28,local_28 + 1);
    iVar2 = -1;
    if (iVar1 == 0) {
      strp = &ctx->options[local_28[0]].description;
      __ptr = *strp;
      if (__ptr != (char *)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(__ptr);
        }
        else {
          (*replaced_cargo_free)(__ptr);
        }
        *strp = (char *)0x0;
      }
      iVar2 = cargo_vasprintf(strp,fmt,ap);
      iVar2 = iVar2 >> 0x1f;
    }
    return iVar2;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1568,
                "int cargo_set_option_descriptionv(cargo_t, const char *, const char *, struct __va_list_tag *)"
               );
}

Assistant:

int cargo_set_option_descriptionv(cargo_t ctx,
                                  const char *optname,
                                  const char *fmt, va_list ap)
{
    int ret = 0;
    size_t opt_i = 0;
    size_t name_i = 0;
    cargo_opt_t *opt = NULL;
    assert(ctx);

    if (_cargo_find_option_name(ctx, optname, &opt_i, &name_i))
    {
        CARGODBG(1, "Failed to find option \"%s\"\n", optname);
        return -1;
    }

    opt = &ctx->options[opt_i];

    _cargo_xfree(&opt->description);

    ret = cargo_vasprintf(&opt->description, fmt, ap);
    return (ret >= 0) ? 0 : -1;
}